

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  cmMakefile *pcVar1;
  pointer pSVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  reference ppcVar6;
  pointer pSVar7;
  reference this_00;
  string local_460;
  allocator local_439;
  Directory local_438;
  undefined1 local_410 [8];
  string outP;
  undefined1 local_3d8 [8];
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> children;
  size_t i;
  __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
  local_3b0;
  const_iterator gi;
  vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *testers;
  string local_398;
  char *local_378;
  char *testIncludeFile;
  Directory local_348;
  undefined1 local_320 [8];
  cmGeneratedFileStream fout;
  Directory local_d0;
  string local_a8 [8];
  string file;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  allocator local_31;
  string local_30;
  cmLocalGenerator *local_10;
  cmLocalGenerator *this_local;
  
  pcVar1 = this->Makefile;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"CMAKE_TESTING_ENABLED",&local_31);
  bVar3 = cmMakefile::IsOn(pcVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config);
    cmMakefile::GetConfigurations
              ((string *)((long)&file.field_2 + 8),this->Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config,false);
    cmState::Snapshot::GetDirectory(&local_d0,&this->StateSnapshot);
    pcVar4 = cmState::Directory::GetCurrentBinary(&local_d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar4,(allocator *)&fout.field_0x247);
    std::allocator<char>::~allocator((allocator<char> *)&fout.field_0x247);
    std::__cxx11::string::operator+=(local_a8,"/");
    std::__cxx11::string::operator+=(local_a8,"CTestTestfile.cmake");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_320,pcVar4,false);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_320,true);
    poVar5 = std::operator<<((ostream *)local_320,"# CMake generated Testfile for ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"# Source directory: ");
    cmState::Snapshot::GetDirectory(&local_348,&this->StateSnapshot);
    pcVar4 = cmState::Directory::GetCurrentSource(&local_348);
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"# Build directory: ");
    cmState::Snapshot::GetDirectory((Directory *)&testIncludeFile,&this->StateSnapshot);
    pcVar4 = cmState::Directory::GetCurrentBinary((Directory *)&testIncludeFile);
    poVar5 = std::operator<<(poVar5,pcVar4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"# ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"# This file includes the relevant testing commands ");
    poVar5 = std::operator<<(poVar5,"required for ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"# testing this directory and lists subdirectories to ");
    poVar5 = std::operator<<(poVar5,"be tested as well.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_398,"TEST_INCLUDE_FILE",(allocator *)((long)&testers + 7));
    pcVar4 = cmMakefile::GetProperty(pcVar1,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator((allocator<char> *)((long)&testers + 7));
    local_378 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      poVar5 = std::operator<<((ostream *)local_320,"include(\"");
      poVar5 = std::operator<<(poVar5,local_378);
      poVar5 = std::operator<<(poVar5,"\")");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    gi._M_current = (cmTestGenerator **)cmMakefile::GetTestGenerators(this->Makefile);
    local_3b0._M_current =
         (cmTestGenerator **)
         std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::begin
                   ((vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *)gi._M_current);
    while( true ) {
      i = (size_t)std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::end
                            ((vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *)
                             gi._M_current);
      bVar3 = __gnu_cxx::operator!=
                        (&local_3b0,
                         (__normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
                          *)&i);
      if (!bVar3) break;
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
                ::operator*(&local_3b0);
      cmTestGenerator::Compute(*ppcVar6,this);
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
                ::operator*(&local_3b0);
      cmScriptGenerator::Generate
                (&(*ppcVar6)->super_cmScriptGenerator,(ostream *)local_320,
                 (string *)((long)&file.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
      __gnu_cxx::
      __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
      ::operator++(&local_3b0);
    }
    cmMakefile::GetStateSnapshot((Snapshot *)((long)&outP.field_2 + 8),this->Makefile);
    cmState::Snapshot::GetChildren
              ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_3d8,
               (Snapshot *)((long)&outP.field_2 + 8));
    for (children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pSVar2 = children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
        pSVar7 = (pointer)std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::size
                                    ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>
                                      *)local_3d8), pSVar2 < pSVar7;
        children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&(children.
                               super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->State + 1)) {
      std::operator<<((ostream *)local_320,"subdirs(");
      this_00 = std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::operator[]
                          ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)
                           local_3d8,
                           (size_type)
                           children.
                           super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmState::Snapshot::GetDirectory(&local_438,this_00);
      pcVar4 = cmState::Directory::GetCurrentBinary(&local_438);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_410,pcVar4,&local_439);
      std::allocator<char>::~allocator((allocator<char> *)&local_439);
      cmOutputConverter::Convert
                (&local_460,&this->super_cmOutputConverter,(string *)local_410,START_OUTPUT,
                 UNCHANGED);
      std::operator<<((ostream *)local_320,(string *)&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      poVar5 = std::operator<<((ostream *)local_320,")");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_410);
    }
    std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::~vector
              ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_3d8);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_320);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&config);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if ( !this->Makefile->IsOn("CMAKE_TESTING_ENABLED") )
    {
    return;
    }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file =
      this->StateSnapshot.GetDirectory().GetCurrentBinary();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary()
       << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if ( testIncludeFile )
    {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
    }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const&
    testers = this->Makefile->GetTestGenerators();
  for(std::vector<cmTestGenerator*>::const_iterator gi = testers.begin();
      gi != testers.end(); ++gi)
    {
    (*gi)->Compute(this);
    (*gi)->Generate(fout, config, configurationTypes);
    }
  size_t i;
  std::vector<cmState::Snapshot> children
      = this->Makefile->GetStateSnapshot().GetChildren();
  for(i = 0; i < children.size(); ++i)
    {
    // TODO: Use add_subdirectory instead?
    fout << "subdirs(";
    std::string outP = children[i].GetDirectory().GetCurrentBinary();
    fout << this->Convert(outP,START_OUTPUT);
    fout << ")" << std::endl;
    }
}